

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linkedlist_add.c
# Opt level: O0

int test_linkedlist_add(void)

{
  int iVar1;
  s_linkedlist *linked_list_00;
  char *pcVar2;
  char cVar3;
  uint error;
  s_linkedlist *linked_list;
  
  linked_list_00 = linkedlist_create();
  pcVar2 = strdup("apple");
  linkedlist_add(linked_list_00,0,pcVar2);
  pcVar2 = strdup("banana");
  linkedlist_add(linked_list_00,0,pcVar2);
  pcVar2 = strdup("clementine");
  linkedlist_add(linked_list_00,1,pcVar2);
  pcVar2 = strdup("damson plum");
  linkedlist_add(linked_list_00,2,pcVar2);
  pcVar2 = strdup("elderberry");
  linkedlist_add(linked_list_00,3,pcVar2);
  pcVar2 = strdup("fig");
  linkedlist_add(linked_list_00,4,pcVar2);
  cVar3 = linked_list_00->size != 6;
  pcVar2 = (char *)linkedlist_get(linked_list_00,5);
  iVar1 = strcmp_with_s2_nullcheck("apple",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  pcVar2 = (char *)linkedlist_get(linked_list_00,0);
  iVar1 = strcmp_with_s2_nullcheck("banana",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  pcVar2 = (char *)linkedlist_get(linked_list_00,1);
  iVar1 = strcmp_with_s2_nullcheck("clementine",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  pcVar2 = (char *)linkedlist_get(linked_list_00,2);
  iVar1 = strcmp_with_s2_nullcheck("damson plum",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  pcVar2 = (char *)linkedlist_get(linked_list_00,3);
  iVar1 = strcmp_with_s2_nullcheck("elderberry",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  pcVar2 = (char *)linkedlist_get(linked_list_00,4);
  iVar1 = strcmp_with_s2_nullcheck("fig",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  linkedlist_destroy(linked_list_00,fun_free_memory);
  return (int)(cVar3 == '\0');
}

Assistant:

int test_linkedlist_add(void) {
    s_linkedlist *linked_list = NULL;
    unsigned int error        = 0;

    // Test
    linked_list = linkedlist_create();
    linkedlist_add(linked_list, 0, strdup("apple"));
    linkedlist_add(linked_list, 0, strdup("banana"));
    linkedlist_add(linked_list, 1, strdup("clementine"));
    linkedlist_add(linked_list, 2, strdup("damson plum"));
    linkedlist_add(linked_list, 3, strdup("elderberry"));
    linkedlist_add(linked_list, 4, strdup("fig"));

    // Assert
    if (linked_list->size != 6) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("apple", linkedlist_get(linked_list, 5)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("banana", linkedlist_get(linked_list, 0)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("clementine", linkedlist_get(linked_list, 1)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("damson plum", linkedlist_get(linked_list, 2)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("elderberry", linkedlist_get(linked_list, 3)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("fig", linkedlist_get(linked_list, 4)) != 0) {
        error += 1;
    }

    // Free allocated memory
    linkedlist_destroy(linked_list, &fun_free_memory);

    return (error == 0);
}